

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  string *this_00;
  char *pcVar1;
  bool bVar2;
  cmListFileLexer_Token *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  Delimiter delim;
  long lVar7;
  anon_enum_32 aVar8;
  ostringstream error;
  undefined1 local_1e8 [40];
  cmListFileFunction *local_1c0;
  char *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [24];
  undefined8 uStack_190;
  long *local_188;
  undefined8 uStack_180;
  long local_178 [3];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_160;
  ios_base local_138 [264];
  
  uStack_190 = 0;
  local_178[1] = 0;
  vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178[2] = 0;
  vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188 = local_178;
  local_1a8._8_8_ = 0;
  local_1a8._16_8_ = 0;
  uStack_180 = 0;
  local_178[0] = 0;
  local_1c0 = &this->Function;
  local_1b8 = name;
  local_1b0 = line;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::operator=((string *)local_1c0,(string *)local_1a8);
  this_00 = &(this->Function).super_cmListFileContext.FilePath;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_188);
  (this->Function).super_cmListFileContext.Line = local_178[2];
  local_1e8._0_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1e8._8_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e8._16_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_160.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_1e8);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&vStack_160);
  if (local_188 != local_178) {
    operator_delete(local_188,local_178[0] + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar6 = this->FileName;
  pcVar1 = (char *)(this->Function).super_cmListFileContext.FilePath._M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar1,(ulong)pcVar6);
  pcVar1 = local_1b8;
  pcVar6 = (char *)(this->Function).super_cmListFileContext.Name._M_string_length;
  strlen(local_1b8);
  std::__cxx11::string::_M_replace((ulong)local_1c0,0,pcVar6,(ulong)pcVar1);
  (this->Function).super_cmListFileContext.Line = local_1b0;
  do {
    pcVar3 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar3 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
      pcVar6 = this->FileName;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)local_1e8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x40);
      }
      else {
        sVar4 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      cmListFileLexer_GetCurrentLine(this->Lexer);
      poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"Parse error.  Function missing opening \"(\".",0x2b);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error((char *)local_1e8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_003eeb3f;
    }
  } while (pcVar3->type == cmListFileLexer_Token_Space);
  if (pcVar3->type == cmListFileLexer_Token_ParenLeft) {
    this->Separation = SeparationOkay;
    cmListFileLexer_GetCurrentLine(this->Lexer);
    pcVar3 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar3 != (cmListFileLexer_Token *)0x0) {
      lVar7 = 0;
      do {
        if (pcVar3->type - cmListFileLexer_Token_Space < 2) {
          this->Separation = SeparationOkay;
          goto LAB_003ee6f8;
        }
        switch(pcVar3->type) {
        case cmListFileLexer_Token_Identifier:
        case cmListFileLexer_Token_ArgumentUnquoted:
          bVar2 = AddArgument(this,pcVar3,Unquoted);
          aVar8 = SeparationWarning;
          if (!bVar2) {
            return false;
          }
          break;
        case cmListFileLexer_Token_ParenLeft:
          this->Separation = SeparationOkay;
          bVar2 = AddArgument(this,pcVar3,Unquoted);
          if (!bVar2) {
            return false;
          }
          lVar7 = lVar7 + 1;
          goto LAB_003ee6f8;
        case cmListFileLexer_Token_ParenRight:
          if (lVar7 == 0) {
            return true;
          }
          this->Separation = SeparationOkay;
          bVar2 = AddArgument(this,pcVar3,Unquoted);
          if (!bVar2) {
            return false;
          }
          lVar7 = lVar7 + -1;
          aVar8 = SeparationWarning;
          break;
        case cmListFileLexer_Token_ArgumentQuoted:
          aVar8 = SeparationWarning;
          delim = Quoted;
          goto LAB_003ee7dc;
        case cmListFileLexer_Token_ArgumentBracket:
          aVar8 = SeparationError;
          delim = Bracket;
LAB_003ee7dc:
          bVar2 = AddArgument(this,pcVar3,delim);
          if (!bVar2) {
            return false;
          }
          break;
        case cmListFileLexer_Token_CommentBracket:
          aVar8 = SeparationError;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
          poVar5 = std::operator<<((ostream *)local_1a8,this->FileName);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          cmListFileLexer_GetCurrentLine(this->Lexer);
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"Parse error.  Function missing ending \")\".  ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Instead found ",0xe);
          pcVar6 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," with text \"",0xc);
          poVar5 = std::operator<<(poVar5,pcVar3->text);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error((char *)local_1e8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_003eeb3f;
        }
        this->Separation = aVar8;
LAB_003ee6f8:
        cmListFileLexer_GetCurrentLine(this->Lexer);
        pcVar3 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar3 != (cmListFileLexer_Token *)0x0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
    pcVar6 = this->FileName;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)local_1e8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x40);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Parse error.  Function missing ending \")\".  ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"End of file reached.",0x14);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_1e8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error in cmake code at\n",0x17);
    pcVar6 = this->FileName;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)local_1e8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x40);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    cmListFileLexer_GetCurrentLine(this->Lexer);
    poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Parse error.  Expected \"(\", got ",0x20);
    pcVar6 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," with text \"",0xc);
    pcVar6 = pcVar3->text;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_1e8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
  }
LAB_003eeb3f:
  if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,
                    (ulong)((long)&(((string *)local_1e8._16_8_)->_M_dataplus)._M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Inintialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.FilePath = this->FileName;
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while((token = cmListFileLexer_Scan(this->Lexer)) &&
        token->type == cmListFileLexer_Token_Space) {}
  if(!token)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Function missing opening \"(\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }
  if(token->type != cmListFileLexer_Token_ParenLeft)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while((lastLine = cmListFileLexer_GetCurrentLine(this->Lexer),
         token = cmListFileLexer_Scan(this->Lexer)))
    {
    if(token->type == cmListFileLexer_Token_Space ||
       token->type == cmListFileLexer_Token_Newline)
      {
      this->Separation = SeparationOkay;
      continue;
      }
    if(token->type == cmListFileLexer_Token_ParenLeft)
      {
      parenDepth++;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      }
    else if(token->type == cmListFileLexer_Token_ParenRight)
      {
      if (parenDepth == 0)
        {
        return true;
        }
      parenDepth--;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_Identifier ||
            token->type == cmListFileLexer_Token_ArgumentUnquoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentQuoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Quoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentBracket)
      {
      if(!this->AddArgument(token, cmListFileArgument::Bracket))
        {
        return false;
        }
      this->Separation = SeparationError;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      this->Separation = SeparationError;
      }
    else
      {
      // Error.
      std::ostringstream error;
      error << "Error in cmake code at\n" << this->FileName << ":"
            << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
            << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }

  std::ostringstream error;
  error << "Error in cmake code at\n"
        << this->FileName << ":" << lastLine << ":\n"
        << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  cmSystemTools::Error(error.str().c_str());

  return false;
}